

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O2

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_short>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  ushort uVar1;
  ulong uVar2;
  uint8_t extraout_DL;
  uint8_t i;
  uint8_t extraout_DL_00;
  byte *pbVar3;
  ulong uVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar2 = region->length;
  uVar1 = *(ushort *)(binary + region->offset);
  pbVar3 = binary + region->offset + uVar2;
  i = extraout_DL;
  for (uVar4 = 0; pbVar3 = pbVar3 + -1, uVar4 < uVar2; uVar4 = uVar4 + 1) {
    ToHex_abi_cxx11_(&local_50,(flatbuffers *)(ulong)*pbVar3,i);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    uVar2 = region->length;
    i = extraout_DL_00;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_50,(uint)uVar1);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}